

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

InstanceBuilder * __thiscall
vkb::InstanceBuilder::enable_extensions
          (InstanceBuilder *this,vector<const_char_*,_std::allocator<const_char_*>_> *extensions)

{
  bool bVar1;
  reference ppcVar2;
  char *local_38;
  char *extension;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range1;
  vector<const_char_*,_std::allocator<const_char_*>_> *extensions_local;
  InstanceBuilder *this_local;
  
  __end1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin(extensions);
  extension = (char *)std::vector<const_char_*,_std::allocator<const_char_*>_>::end(extensions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                *)&extension);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              ::operator*(&__end1);
    local_38 = *ppcVar2;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (&(this->info).extensions,&local_38);
    __gnu_cxx::
    __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
    ::operator++(&__end1);
  }
  return this;
}

Assistant:

InstanceBuilder& InstanceBuilder::enable_extensions(std::vector<const char*> const& extensions) {
    for (const auto extension : extensions) {
        info.extensions.push_back(extension);
    }
    return *this;
}